

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void handle_delete(mg_connection *nc,mg_serve_http_opts *opts,char *path)

{
  int iVar1;
  int status_code;
  cs_stat_t st;
  stat64 sStack_a8;
  
  iVar1 = stat64(path,&sStack_a8);
  status_code = 0x194;
  if (iVar1 == 0) {
    if ((sStack_a8.st_mode & 0xf000) == 0x4000) {
      remove_directory(opts,path);
      status_code = 0xcc;
    }
    else {
      iVar1 = remove(path);
      status_code = 0x1a7;
      if (iVar1 == 0) {
        status_code = 0xcc;
      }
    }
  }
  mg_send_head(nc,status_code,0,(char *)0x0);
  return;
}

Assistant:

static void handle_delete(struct mg_connection *nc,
                          const struct mg_serve_http_opts *opts,
                          const char *path) {
    cs_stat_t st;
    if (mg_stat(path, &st) != 0) {
        send_http_error(nc, 404, NULL);
    } else if (S_ISDIR(st.st_mode)) {
        remove_directory(opts, path);
        send_http_error(nc, 204, NULL);
    } else if (remove(path) == 0) {
        send_http_error(nc, 204, NULL);
    } else {
        send_http_error(nc, 423, NULL);
    }
}